

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

void Llb_ManGroupStop(Llb_Grp_t *p)

{
  Llb_Grp_t *p_local;
  
  if (p != (Llb_Grp_t *)0x0) {
    Vec_PtrWriteEntry(p->pMan->vGroups,p->Id,(void *)0x0);
    Vec_PtrFreeP(&p->vIns);
    Vec_PtrFreeP(&p->vOuts);
    Vec_PtrFreeP(&p->vNodes);
    if (p != (Llb_Grp_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Llb_ManGroupStop( Llb_Grp_t * p )
{
    if ( p == NULL )
        return;
    Vec_PtrWriteEntry( p->pMan->vGroups, p->Id, NULL );
    Vec_PtrFreeP( &p->vIns );
    Vec_PtrFreeP( &p->vOuts );
    Vec_PtrFreeP( &p->vNodes );
    ABC_FREE( p );
}